

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp_client.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer *ppuVar1;
  undefined4 *puVar2;
  size_type sVar3;
  long lVar4;
  _func_int ***ppp_Var5;
  typed_value<unsigned_short,_char> *ptVar6;
  char *pcVar7;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar8;
  const_iterator cVar9;
  long *plVar10;
  time_t tVar11;
  any *paVar12;
  unsigned_short *puVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *host;
  service *psVar14;
  execution_context eVar15;
  long lVar16;
  io_service io_service;
  string a;
  sender s;
  thread worker;
  vector<unsigned_char,_std::allocator<unsigned_char>_> received;
  string port_name;
  rudp_server server;
  basic_resolver_entry<boost::asio::ip::udp> remote_endpoint;
  options_description opts;
  variables_map values;
  query query;
  resolver resolver;
  io_context local_470;
  _Any_data local_460;
  _Manager_type local_450;
  code *local_448;
  sender local_440;
  sender *local_418;
  void **local_410;
  code *local_408;
  code *local_400;
  void *local_3f8;
  undefined8 uStack_3f0;
  long local_3e8;
  string local_3d8;
  sockaddr local_3b8;
  code *local_3a8;
  code *local_3a0;
  undefined1 local_398 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388 [5];
  _Any_data local_338;
  _Manager_type local_328;
  _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>,_std::_Select1st<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>_>
  local_318;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::_Select1st<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  local_2e8;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined4 uStack_2a0;
  long *local_298 [2];
  long local_288 [2];
  long *local_278 [2];
  long local_268 [2];
  long *local_258 [2];
  long local_248 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_230 [24];
  void *local_218;
  undefined4 local_210;
  undefined8 local_208;
  undefined4 local_200;
  long local_1f8;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_1f0 [24];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1d8;
  code *local_1b0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_1a0 [8];
  _Rb_tree_node_base local_198;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_140;
  basic_resolver_query<boost::asio::ip::udp> local_110;
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"Options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_258,(string *)local_398,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._0_8_ != local_388) {
    operator_delete((void *)local_398._0_8_,local_388[0]._M_allocated_capacity + 1);
  }
  local_1b0[0] = (code *)boost::program_options::options_description::add_options();
  ptVar6 = boost::program_options::value<unsigned_short>((unsigned_short *)0x0);
  local_110.hints_.ai_flags._0_2_ = 8000;
  ptVar6 = boost::program_options::typed_value<unsigned_short,_char>::default_value
                     (ptVar6,(unsigned_short *)&local_110);
  pcVar7 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_1b0,(value_semantic *)"remote_port,r",(char *)ptVar6);
  ptVar6 = boost::program_options::value<unsigned_short>((unsigned_short *)0x0);
  local_2b8.container._0_2_ = 0x1f41;
  ptVar6 = boost::program_options::typed_value<unsigned_short,_char>::default_value
                     (ptVar6,(unsigned_short *)&local_2b8);
  pcVar7 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar7,(value_semantic *)"self_port,s",(char *)ptVar6);
  ptVar8 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"localhost","");
  ptVar8 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_398);
  pcVar7 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar7,(value_semantic *)"host,H",(char *)ptVar8);
  boost::program_options::options_description_easy_init::operator()(pcVar7,"help,h");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._0_8_ != local_388) {
    operator_delete((void *)local_398._0_8_,local_388[0]._M_allocated_capacity + 1);
  }
  boost::program_options::variables_map::variables_map((variables_map *)local_1b0);
  local_1d8.super_function_base.vtable = (vtable_base *)0x0;
  local_1d8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_1d8.super_function_base.functor._8_8_ = 0;
  local_1d8.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_398,argc,argv,(options_description *)local_258,0,
             &local_1d8);
  boost::program_options::store((basic_parsed_options *)local_398,(variables_map *)local_1b0,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_398);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_1d8);
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"help","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_1a0,(key_type *)local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._0_8_ != local_388) {
    operator_delete((void *)local_398._0_8_,local_388[0]._M_allocated_capacity + 1);
  }
  if (cVar9._M_node != &local_198) {
    plVar10 = (long *)boost::program_options::operator<<
                                ((ostream *)&std::cout,(options_description *)local_258);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    goto LAB_0012d726;
  }
  tVar11 = time((time_t *)0x0);
  srand((uint)tVar11);
  boost::asio::io_context::io_context(&local_470);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>(&local_a0,&local_470,(type *)0x0);
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  local_3d8._M_string_length = 0;
  local_3d8.field_2._M_local_buf[0] = '\0';
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"remote_port","");
  paVar12 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_1b0);
  puVar13 = boost::any_cast<unsigned_short_const&>(paVar12);
  local_2b8.container = &local_3d8;
  local_440.head._M_current._0_2_ = *puVar13;
  local_110.hints_._0_8_ = &local_2b8;
  boost::spirit::karma::int_inserter<10u,boost::spirit::unused_type,boost::spirit::unused_type>::
  call<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::__cxx11::string>,mpl_::int_<0>,boost::spirit::unused_type>,unsigned_short>
            ((output_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_mpl_::int_<0>,_boost::spirit::unused_type>
              *)&local_110,*puVar13,(unsigned_short *)&local_440,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._0_8_ != local_388) {
    operator_delete((void *)local_398._0_8_,local_388[0]._M_allocated_capacity + 1);
  }
  local_398._0_8_ = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"host","");
  paVar12 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_1b0);
  host = boost::any_cast<std::__cxx11::string_const&>(paVar12);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::udp>::basic_resolver_query
            (&local_110,host,&local_3d8,address_configured);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._0_8_ != local_388) {
    operator_delete((void *)local_398._0_8_,local_388[0]._M_allocated_capacity + 1);
  }
  boost::asio::ip::
  basic_resolver<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::resolve((results_type *)local_398,
            (basic_resolver<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             *)&local_a0,&local_110);
  sVar3 = *(size_type *)local_398._0_8_;
  lVar16 = local_388[0]._M_allocated_capacity * 0x60;
  local_2b8.container =
       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(sVar3 + lVar16);
  uStack_2b0 = *(undefined4 *)((undefined8 *)(sVar3 + lVar16) + 1);
  puVar2 = (undefined4 *)(sVar3 + 0xc + lVar16);
  uStack_2ac = *puVar2;
  uStack_2a8 = puVar2[1];
  uStack_2a4 = puVar2[2];
  uStack_2a0 = puVar2[3];
  lVar4 = *(long *)(sVar3 + 0x20 + lVar16);
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_298,lVar4,*(long *)(sVar3 + 0x28 + lVar16) + lVar4);
  lVar4 = *(long *)(sVar3 + lVar16 + 0x40);
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_278,lVar4,*(long *)(sVar3 + lVar16 + 0x48) + lVar4);
  if ((pointer)local_398._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._8_8_);
  }
  local_3f8 = (void *)0x0;
  uStack_3f0 = 0;
  local_3e8 = 0;
  ppuVar1 = &local_440.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_440.head._M_current = (uchar *)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"self_port","");
  paVar12 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_1b0);
  puVar13 = boost::any_cast<unsigned_short_const&>(paVar12);
  local_460._8_8_ = 0;
  local_448 = std::
              _Function_handler<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp_client.cpp:84:5)>
              ::_M_invoke;
  local_450 = std::
              _Function_handler<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp_client.cpp:84:5)>
              ::_M_manager;
  local_460._M_unused._M_object = &local_3f8;
  rudp::rudp_server::rudp_server
            ((rudp_server *)local_398,&local_470,*puVar13,
             (function<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&)>
              *)&local_460);
  if (local_450 != (_Manager_type)0x0) {
    (*local_450)(&local_460,&local_460,__destroy_functor);
  }
  if ((pointer *)local_440.head._M_current != ppuVar1) {
    operator_delete(local_440.head._M_current,
                    (ulong)(local_440.data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish + 1));
  }
  sender::sender(&local_440,(rudp_server *)local_398);
  local_460._M_unused._M_object = &local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"abcde","");
  uStack_44 = CONCAT44(uStack_2a0,uStack_2a4);
  uStack_48 = uStack_2a8;
  local_58 = local_2b8.container;
  uStack_50 = uStack_2b0;
  uStack_4c = uStack_2ac;
  local_3b8.sa_data[6] = '\0';
  local_3b8.sa_data[7] = '\0';
  local_3b8.sa_data[8] = '\0';
  local_3b8.sa_data[9] = '\0';
  local_3b8.sa_data[10] = '\0';
  local_3b8.sa_data[0xb] = '\0';
  local_3b8.sa_data[0xc] = '\0';
  local_3b8.sa_data[0xd] = '\0';
  local_3a0 = std::
              _Function_handler<void_(bool,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp_client.cpp:94:36)>
              ::_M_invoke;
  local_3a8 = std::
              _Function_handler<void_(bool,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp_client.cpp:94:36)>
              ::_M_manager;
  local_400 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp_client.cpp:101:3)>
              ::_M_invoke;
  local_408 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp_client.cpp:101:3)>
              ::_M_manager;
  local_418 = &local_440;
  local_410 = &local_3f8;
  local_3b8._0_8_ = &local_440;
  rudp::rudp_server::connect
            ((rudp_server *)local_398,(int)&local_58,&local_3b8,(socklen_t)&local_418);
  if (local_408 != (code *)0x0) {
    (*local_408)(&local_418,&local_418,3);
  }
  if (local_3a8 != (code *)0x0) {
    (*local_3a8)(&local_3b8,&local_3b8,3);
  }
  local_418 = (sender *)0x0;
  local_3b8._0_8_ = operator_new(0x10);
  ((sender *)local_3b8._0_8_)->head = (const_iterator)&PTR___State_00155b00;
  *(io_service **)
   &(((sender *)local_3b8._0_8_)->data).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> = &local_470;
  std::thread::_M_start_thread(&local_418,&local_3b8,0);
  if ((sender *)local_3b8._0_8_ != (sender *)0x0) {
    (**(code **)(*(long *)local_3b8._0_8_ + 8))();
  }
  std::thread::join();
  if (local_418 != (sender *)0x0) {
    std::terminate();
  }
  if ((_Manager_type *)local_460._M_unused._0_8_ != &local_450) {
    operator_delete(local_460._M_unused._M_object,(ulong)(local_450 + 1));
  }
  if (local_440.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_440.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_440.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_440.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::_Select1st<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  ::~_Rb_tree(&local_2e8);
  std::
  _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>,_std::_Select1st<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>_>
  ::~_Rb_tree(&local_318);
  if (local_328 != (_Manager_type)0x0) {
    (*local_328)(&local_338,&local_338,__destroy_functor);
  }
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)local_388);
  if (local_3f8 != (void *)0x0) {
    operator_delete(local_3f8,local_3e8 - (long)local_3f8);
  }
  if (local_278[0] != local_268) {
    operator_delete(local_278[0],local_268[0] + 1);
  }
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  if (local_110.service_name_._M_dataplus._M_p != (pointer)((long)&local_110 + 0x60U)) {
    operator_delete(local_110.service_name_._M_dataplus._M_p,
                    local_110.service_name_.field_2._M_allocated_capacity + 1);
  }
  if (local_110.host_name_._M_dataplus._M_p != (pointer)((long)&local_110 + 0x40U)) {
    operator_delete(local_110.host_name_._M_dataplus._M_p,
                    local_110.host_name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,
                    CONCAT71(local_3d8.field_2._M_allocated_capacity._1_7_,
                             local_3d8.field_2._M_local_buf[0]) + 1);
  }
  boost::asio::detail::
  io_object_impl<boost::asio::detail::resolver_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&local_a0);
  psVar14 = (local_470.super_execution_context.service_registry_)->first_service_;
  eVar15.service_registry_ = local_470.super_execution_context.service_registry_;
  if (psVar14 == (service *)0x0) {
LAB_0012d710:
    pthread_mutex_destroy((pthread_mutex_t *)&(eVar15.service_registry_)->mutex_);
  }
  else {
    do {
      (*psVar14->_vptr_service[2])(psVar14);
      eVar15.service_registry_ = local_470.super_execution_context.service_registry_;
      psVar14 = psVar14->next_;
    } while (psVar14 != (service *)0x0);
    psVar14 = (local_470.super_execution_context.service_registry_)->first_service_;
    if (psVar14 == (service *)0x0) goto LAB_0012d710;
    do {
      ppp_Var5 = &psVar14->_vptr_service;
      psVar14 = psVar14->next_;
      (*(*ppp_Var5)[1])();
      (eVar15.service_registry_)->first_service_ = psVar14;
    } while (psVar14 != (service *)0x0);
    eVar15.service_registry_ = local_470.super_execution_context.service_registry_;
    if (local_470.super_execution_context.service_registry_ != (service_registry *)0x0)
    goto LAB_0012d710;
    eVar15.service_registry_ = (service_registry *)0x0;
  }
  operator_delete(eVar15.service_registry_,0x40);
LAB_0012d726:
  local_1b0[0] = std::thread::join;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_140);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_170);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_1a0);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_1f0);
  if (local_218 != (void *)0x0) {
    operator_delete(local_218,local_1f8 - (long)local_218);
    local_218 = (void *)0x0;
    local_210 = 0;
    local_208 = 0;
    local_200 = 0;
    local_1f8 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_230);
  if (local_258[0] != local_248) {
    operator_delete(local_258[0],local_248[0] + 1);
  }
  return 0;
}

Assistant:

int main( int argc, char *argv[] ) {
  namespace po = boost::program_options;
  po::options_description opts( "Options" );
  opts.add_options()
    ( "remote_port,r", po::value< uint16_t >()->default_value( 8000 ), "port" )
    ( "self_port,s", po::value< uint16_t >()->default_value( 8001 ), "port" )
    ( "host,H", po::value< std::string >()->default_value( "localhost" ), "host" )
    ( "help,h", "display this message" );
  po::variables_map values;
  po::store( po::parse_command_line( argc, argv, opts ), values );
  if( values.count("help") ) {
    std::cout << opts << std::endl;
    return 0;
  }
  srand( time( nullptr ) );
  boost::asio::io_service io_service;
  using boost::asio::ip::udp;
  udp::resolver resolver( io_service );
  std::string port_name;
  boost::spirit::karma::generate( std::back_inserter( port_name ), boost::spirit::karma::ushort_, values[ "remote_port" ].as< uint16_t >() );
  udp::resolver::query query( values[ "host" ].as< std::string >(), port_name );
  const auto remote_endpoint = *resolver.resolve( query );
  std::vector< uint8_t > received;
  rudp::rudp_server server( io_service, values[ "self_port" ].as< uint16_t >(),
    [&]( rudp::rudp_server&, uint32_t ident, const rudp::buffers_ptr_t &bufs ) {
      std::cout << "received" << std::endl;
      for( const auto &buf: *bufs ) {
        const auto header_size = (*buf)[ 1 ];
        received.insert( received.end(), std::next( buf->begin(), header_size ), buf->end() );
      }
    }
  );
  sender s( server );
  std::string a( "abcde" );
  server.connect( remote_endpoint, [&]( bool status, uint32_t identifier ) {
    if( status ) {
      std::cout << "connected" << std::endl;
      s( identifier );
    }
    else std::cout << "failed" << std::endl;
  },
  [&]() {
    std::cout << "closed" << std::endl;
    s.check( received );
  } );
  std::thread worker( [&]() { io_service.run(); } );
  worker.join();
}